

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O2

string * __thiscall kratos::Var::base_name_abi_cxx11_(string *__return_storage_ptr__,Var *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual std::string base_name() const { return name; }